

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_extension_instances_free(ly_ctx *ctx,lys_ext_instance **e,uint size)

{
  lys_ext *plVar1;
  lys_node *plVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  long *plVar5;
  lys_node *snext;
  lys_node *siter;
  void **start;
  void **pp;
  lyext_substmt *substmt;
  uint k;
  uint j;
  uint i;
  uint size_local;
  lys_ext_instance **e_local;
  ly_ctx *ctx_local;
  
  if (((size != 0) && (e != (lys_ext_instance **)0x0)) && (*e != (lys_ext_instance *)0x0)) {
    for (k = 0; k < size; k = k + 1) {
      if (e[k] != (lys_ext_instance *)0x0) {
        if ((e[k]->flags & 1) == 0) {
          if ((e[k]->flags & 2) != 0) {
            free(e[k]->def);
            e[k]->def = (lys_ext *)0x0;
            yang_free_ext_data((yang_ext_substmt *)e[k]->parent);
          }
          lys_extension_instances_free(ctx,e[k]->ext,(uint)e[k]->ext_size);
          lydict_remove(ctx,e[k]->arg_value);
        }
        if (((e[k]->def != (lys_ext *)0x0) && (e[k]->def->plugin != (lyext_plugin *)0x0)) &&
           (e[k]->def->plugin->type == LYEXT_COMPLEX)) {
          plVar1 = e[k][1].def;
          substmt._4_4_ = 0;
          while (*(int *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0x1b) != 0) {
            switch(*(undefined4 *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0x1b)) {
            case 1:
            case 2:
            case 3:
            case 4:
            case 5:
            case 6:
            case 7:
            case 8:
            case 9:
            case 10:
            case 0xb:
            case 0xc:
            case 0xd:
            case 0xe:
            case 0xf:
            case 0x10:
            case 0x11:
              lys_extcomplex_free_str
                        (ctx,(lys_ext_instance_complex *)e[k],
                         *(LY_STMT *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0x1b));
              break;
            case 0x12:
            case 0x1c:
            case 0x1d:
            case 0x1e:
              plVar5 = (long *)((long)&e[k][1].arg_value +
                               *(long *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0x13) + 4)
              ;
              if ((1 < *(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb)) &&
                 (*plVar5 != 0)) {
                substmt._0_4_ = 0;
                while (*(long *)(*plVar5 + (ulong)(uint)substmt * 8) != 0) {
                  free(*(void **)(*plVar5 + (ulong)(uint)substmt * 8));
                  substmt._0_4_ = (uint)substmt + 1;
                }
              }
              free((void *)*plVar5);
              break;
            default:
              break;
            case 0x1b:
              if (1 < *(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb)) {
                free(*(void **)((long)&e[k][1].arg_value +
                               *(long *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0x13) + 4)
                    );
              }
              break;
            case 0x1f:
              plVar5 = (long *)lys_ext_complex_get_substmt
                                         (LY_STMT_UNIQUE,(lys_ext_instance_complex *)e[k],
                                          (lyext_substmt **)0x0);
              if ((plVar5 != (long *)0x0) && (*plVar5 != 0)) {
                if (*(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb) < 2) {
                  for (substmt._0_4_ = 0; (uint)substmt < *(byte *)(*plVar5 + 8);
                      substmt._0_4_ = (uint)substmt + 1) {
                    lydict_remove(ctx,*(char **)(*(long *)*plVar5 + (ulong)(uint)substmt * 8));
                  }
                  free(*(void **)*plVar5);
                  free((void *)*plVar5);
                }
                else {
                  ppvVar3 = (void **)*plVar5;
                  for (start = ppvVar3; *start != (void *)0x0; start = start + 1) {
                    for (substmt._0_4_ = 0; (uint)substmt < *(byte *)((long)*start + 8);
                        substmt._0_4_ = (uint)substmt + 1) {
                      lydict_remove(ctx,*(char **)(**start + (ulong)(uint)substmt * 8));
                    }
                    free(**start);
                    free(*start);
                  }
                  free(ppvVar3);
                }
              }
              break;
            case 0x20:
              if (1 < *(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb)) {
                free(*(void **)((long)&e[k][1].arg_value +
                               *(long *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0x13) + 4)
                    );
              }
              break;
            case 0x21:
            case 0x22:
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x26:
            case 0x27:
            case 0x28:
            case 0x29:
            case 0x2a:
            case 0x2b:
            case 0x2c:
            case 0x2d:
            case 0x2e:
            case 0x39:
              puVar4 = (undefined8 *)
                       ((long)&e[k][1].arg_value +
                       *(long *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0x13) + 4);
              snext = (lys_node *)*puVar4;
              while (snext != (lys_node *)0x0) {
                plVar2 = snext->next;
                lys_node_free(snext,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
                snext = plVar2;
              }
              *puVar4 = 0;
              break;
            case 0x2f:
              plVar5 = (long *)lys_ext_complex_get_substmt
                                         (LY_STMT_TYPEDEF,(lys_ext_instance_complex *)e[k],
                                          (lyext_substmt **)0x0);
              if ((plVar5 != (long *)0x0) && (*plVar5 != 0)) {
                if (*(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb) < 2) {
                  lys_tpdf_free(ctx,(lys_tpdf *)*plVar5);
                  free((void *)*plVar5);
                }
                else {
                  ppvVar3 = (void **)*plVar5;
                  for (start = ppvVar3; *start != (void *)0x0; start = start + 1) {
                    lys_tpdf_free(ctx,(lys_tpdf *)*start);
                    free(*start);
                  }
                  free(ppvVar3);
                }
              }
              break;
            case 0x30:
              plVar5 = (long *)lys_ext_complex_get_substmt
                                         (LY_STMT_TYPE,(lys_ext_instance_complex *)e[k],
                                          (lyext_substmt **)0x0);
              if ((plVar5 != (long *)0x0) && (*plVar5 != 0)) {
                if (*(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb) < 2) {
                  lys_type_free(ctx,(lys_type *)*plVar5);
                  free((void *)*plVar5);
                }
                else {
                  ppvVar3 = (void **)*plVar5;
                  for (start = ppvVar3; *start != (void *)0x0; start = start + 1) {
                    lys_type_free(ctx,(lys_type *)*start);
                    free(*start);
                  }
                  free(ppvVar3);
                }
              }
              break;
            case 0x31:
              plVar5 = (long *)lys_ext_complex_get_substmt
                                         (LY_STMT_IFFEATURE,(lys_ext_instance_complex *)e[k],
                                          (lyext_substmt **)0x0);
              if ((plVar5 != (long *)0x0) && (*plVar5 != 0)) {
                if (*(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb) < 2) {
                  lys_iffeature_free(ctx,(lys_iffeature *)*plVar5,'\x01');
                }
                else {
                  ppvVar3 = (void **)*plVar5;
                  for (start = ppvVar3; *start != (void *)0x0; start = start + 1) {
                    lys_iffeature_free(ctx,(lys_iffeature *)*start,'\x01');
                  }
                  free(ppvVar3);
                }
              }
              break;
            case 0x32:
            case 0x33:
            case 0x34:
            case 0x35:
              plVar5 = (long *)lys_ext_complex_get_substmt
                                         (*(LY_STMT *)
                                           (plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0x1b),
                                          (lys_ext_instance_complex *)e[k],(lyext_substmt **)0x0);
              if ((plVar5 != (long *)0x0) && (*plVar5 != 0)) {
                if (*(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb) < 2) {
                  lys_restr_free(ctx,(lys_restr *)*plVar5);
                  free((void *)*plVar5);
                }
                else {
                  ppvVar3 = (void **)*plVar5;
                  for (start = ppvVar3; *start != (void *)0x0; start = start + 1) {
                    lys_restr_free(ctx,(lys_restr *)*start);
                    free(*start);
                  }
                  free(ppvVar3);
                }
              }
              break;
            case 0x36:
              plVar5 = (long *)lys_ext_complex_get_substmt
                                         (LY_STMT_WHEN,(lys_ext_instance_complex *)e[k],
                                          (lyext_substmt **)0x0);
              if ((plVar5 != (long *)0x0) && (*plVar5 != 0)) {
                if (*(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb) < 2) {
                  lys_when_free(ctx,(lys_when *)*plVar5);
                }
                else {
                  ppvVar3 = (void **)*plVar5;
                  for (start = ppvVar3; *start != (void *)0x0; start = start + 1) {
                    lys_when_free(ctx,(lys_when *)*start);
                  }
                  free(ppvVar3);
                }
              }
              break;
            case 0x37:
              plVar5 = (long *)lys_ext_complex_get_substmt
                                         (LY_STMT_REVISION,(lys_ext_instance_complex *)e[k],
                                          (lyext_substmt **)0x0);
              if ((plVar5 != (long *)0x0) && (*plVar5 != 0)) {
                if (*(uint *)(plVar1->padding + (ulong)substmt._4_4_ * 0x18 + -0xb) < 2) {
                  lydict_remove(ctx,*(char **)(*plVar5 + 0x18));
                  lydict_remove(ctx,*(char **)(*plVar5 + 0x20));
                  lys_extension_instances_free
                            (ctx,*(lys_ext_instance ***)(*plVar5 + 0x10),
                             (uint)*(byte *)(*plVar5 + 0xb));
                  free((void *)*plVar5);
                }
                else {
                  ppvVar3 = (void **)*plVar5;
                  for (start = ppvVar3; *start != (void *)0x0; start = start + 1) {
                    lydict_remove(ctx,*(char **)((long)*start + 0x18));
                    lydict_remove(ctx,*(char **)((long)*start + 0x20));
                    lys_extension_instances_free
                              (ctx,*(lys_ext_instance ***)((long)*start + 0x10),
                               (uint)*(byte *)((long)*start + 0xb));
                    free(*start);
                  }
                  free(ppvVar3);
                }
              }
            }
            substmt._4_4_ = substmt._4_4_ + 1;
          }
        }
        free(e[k]);
      }
    }
    free(e);
  }
  return;
}

Assistant:

void
lys_extension_instances_free(struct ly_ctx *ctx, struct lys_ext_instance **e, unsigned int size)
{
    unsigned int i, j, k;
    struct lyext_substmt *substmt;
    void **pp, **start;
    struct lys_node *siter, *snext;

#define EXTCOMPLEX_FREE_STRUCT(STMT, TYPE, FUNC, FREE, ARGS...)                               \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)e[i], NULL);    \
    if (!pp || !(*pp)) { break; }                                                             \
    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */                    \
        for (start = pp = *pp; *pp; pp++) {                                                   \
            FUNC(ctx, (TYPE *)(*pp), ##ARGS);                                                 \
            if (FREE) { free(*pp); }                                                          \
        }                                                                                     \
        free(start);                                                                          \
    } else { /* single item */                                                                \
        FUNC(ctx, (TYPE *)(*pp), ##ARGS);                                                     \
        if (FREE) { free(*pp); }                                                              \
    }

    if (!size || !e || !(*e)) {
        return;
    }

    for (i = 0; i < size; i++) {
        if (!e[i]) {
            continue;
        }

        if (e[i]->flags & (LYEXT_OPT_INHERIT)) {
            /* no free, this is just a shadow copy of the original extension instance */
        } else {
            if (e[i]->flags & (LYEXT_OPT_YANG)) {
                free(e[i]->def);     /* remove name of instance extension */
                e[i]->def = NULL;
                yang_free_ext_data((struct yang_ext_substmt *)e[i]->parent); /* remove backup part of yang file */
            }
            lys_extension_instances_free(ctx, e[i]->ext, e[i]->ext_size);
            lydict_remove(ctx, e[i]->arg_value);
        }

        if (e[i]->def && e[i]->def->plugin && e[i]->def->plugin->type == LYEXT_COMPLEX) {
            substmt = ((struct lys_ext_instance_complex *)e[i])->substmt;
            for (j = 0; substmt[j].stmt; j++) {
                switch(substmt[j].stmt) {
                case LY_STMT_DESCRIPTION:
                case LY_STMT_REFERENCE:
                case LY_STMT_UNITS:
                case LY_STMT_ARGUMENT:
                case LY_STMT_DEFAULT:
                case LY_STMT_ERRTAG:
                case LY_STMT_ERRMSG:
                case LY_STMT_PREFIX:
                case LY_STMT_NAMESPACE:
                case LY_STMT_PRESENCE:
                case LY_STMT_REVISIONDATE:
                case LY_STMT_KEY:
                case LY_STMT_BASE:
                case LY_STMT_BELONGSTO:
                case LY_STMT_CONTACT:
                case LY_STMT_ORGANIZATION:
                case LY_STMT_PATH:
                    lys_extcomplex_free_str(ctx, (struct lys_ext_instance_complex *)e[i], substmt[j].stmt);
                    break;
                case LY_STMT_TYPE:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_TYPE, struct lys_type, lys_type_free, 1);
                    break;
                case LY_STMT_TYPEDEF:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_TYPEDEF, struct lys_tpdf, lys_tpdf_free, 1);
                    break;
                case LY_STMT_IFFEATURE:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_IFFEATURE, struct lys_iffeature, lys_iffeature_free, 0, 1);
                    break;
                case LY_STMT_MAX:
                case LY_STMT_MIN:
                case LY_STMT_POSITION:
                case LY_STMT_VALUE:
                    pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME && *pp) {
                        for(k = 0; ((uint32_t**)(*pp))[k]; k++) {
                            free(((uint32_t**)(*pp))[k]);
                        }
                    }
                    free(*pp);
                    break;
                case LY_STMT_DIGITS:
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) {
                        /* free the array */
                        pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                        free(*pp);
                    }
                    break;
                case LY_STMT_MODULE:
                    /* modules are part of the context, so they will be freed there */
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) {
                        /* free the array */
                        pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                        free(*pp);
                    }
                    break;
                case LY_STMT_ACTION:
                case LY_STMT_ANYDATA:
                case LY_STMT_ANYXML:
                case LY_STMT_CASE:
                case LY_STMT_CHOICE:
                case LY_STMT_CONTAINER:
                case LY_STMT_GROUPING:
                case LY_STMT_INPUT:
                case LY_STMT_LEAF:
                case LY_STMT_LEAFLIST:
                case LY_STMT_LIST:
                case LY_STMT_NOTIFICATION:
                case LY_STMT_OUTPUT:
                case LY_STMT_RPC:
                case LY_STMT_USES:
                    pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                    LY_TREE_FOR_SAFE((struct lys_node *)(*pp), snext, siter) {
                        lys_node_free(siter, NULL, 0);
                    }
                    *pp = NULL;
                    break;
                case LY_STMT_UNIQUE:
                    pp = lys_ext_complex_get_substmt(LY_STMT_UNIQUE, (struct lys_ext_instance_complex *)e[i], NULL);
                    if (!pp || !(*pp)) {
                        break;
                    }
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */
                        for (start = pp = *pp; *pp; pp++) {
                            for (k = 0; k < (*(struct lys_unique**)pp)->expr_size; k++) {
                                lydict_remove(ctx, (*(struct lys_unique**)pp)->expr[k]);
                            }
                            free((*(struct lys_unique**)pp)->expr);
                            free(*pp);
                        }
                        free(start);
                    } else { /* single item */
                        for (k = 0; k < (*(struct lys_unique**)pp)->expr_size; k++) {
                            lydict_remove(ctx, (*(struct lys_unique**)pp)->expr[k]);
                        }
                        free((*(struct lys_unique**)pp)->expr);
                        free(*pp);
                    }
                    break;
                case LY_STMT_LENGTH:
                case LY_STMT_MUST:
                case LY_STMT_PATTERN:
                case LY_STMT_RANGE:
                    EXTCOMPLEX_FREE_STRUCT(substmt[j].stmt, struct lys_restr, lys_restr_free, 1);
                    break;
                case LY_STMT_WHEN:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_WHEN, struct lys_when, lys_when_free, 0);
                    break;
                case LY_STMT_REVISION:
                    pp = lys_ext_complex_get_substmt(LY_STMT_REVISION, (struct lys_ext_instance_complex *)e[i], NULL);
                    if (!pp || !(*pp)) {
                        break;
                    }
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */
                        for (start = pp = *pp; *pp; pp++) {
                            lydict_remove(ctx, (*(struct lys_revision**)pp)->dsc);
                            lydict_remove(ctx, (*(struct lys_revision**)pp)->ref);
                            lys_extension_instances_free(ctx, (*(struct lys_revision**)pp)->ext,
                                                         (*(struct lys_revision**)pp)->ext_size);
                            free(*pp);
                        }
                        free(start);
                    } else { /* single item */
                        lydict_remove(ctx, (*(struct lys_revision**)pp)->dsc);
                        lydict_remove(ctx, (*(struct lys_revision**)pp)->ref);
                        lys_extension_instances_free(ctx, (*(struct lys_revision**)pp)->ext,
                                                     (*(struct lys_revision**)pp)->ext_size);
                        free(*pp);
                    }
                    break;
                default:
                    /* nothing to free */
                    break;
                }
            }
        }

        free(e[i]);
    }
    free(e);

#undef EXTCOMPLEX_FREE_STRUCT
}